

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O3

void inflate_fast(z_streamp strm,uint start)

{
  byte *pbVar1;
  byte *pbVar2;
  Bytef *pBVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  internal_state *piVar10;
  Posf *pPVar11;
  Posf *pPVar12;
  uInt uVar13;
  uInt uVar14;
  uint uVar15;
  char *pcVar16;
  uint uVar17;
  undefined4 uVar18;
  long lVar19;
  Bytef *pBVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  Bytef *pBVar26;
  Posf PVar27;
  uint uVar28;
  Bytef *pBVar29;
  uint uVar30;
  Bytef *pBVar31;
  int local_40;
  
  piVar10 = strm->state;
  pBVar29 = strm->next_in + ((ulong)(strm->avail_in - 5) - 1);
  pBVar20 = strm->next_in + -1;
  pBVar26 = strm->next_out + -1;
  local_40 = (int)pBVar26 - (start - strm->avail_out);
  pBVar31 = strm->next_out + ((ulong)(strm->avail_out - 0x101) - 1);
  iVar7 = *(int *)((long)&piVar10->gzhead + 4);
  uVar8 = piVar10->gzindex;
  uVar9 = *(uint *)&piVar10->method;
  lVar21 = *(long *)&piVar10->last_flush;
  uVar24._0_4_ = piVar10->w_bits;
  uVar24._4_4_ = piVar10->w_mask;
  uVar15 = *(uint *)&piVar10->window;
  uVar13 = piVar10->ins_h;
  uVar14 = piVar10->hash_size;
  pPVar11 = piVar10->prev;
  pPVar12 = piVar10->head;
LAB_0014640f:
  if (uVar15 < 0xf) {
    pbVar1 = pBVar20 + 1;
    pbVar2 = pBVar20 + 2;
    pBVar20 = pBVar20 + 2;
    uVar24 = ((ulong)*pbVar2 << ((byte)uVar15 + 8 & 0x3f)) +
             ((ulong)*pbVar1 << ((byte)uVar15 & 0x3f)) + uVar24;
    uVar15 = uVar15 | 0x10;
  }
  uVar23 = (ulong)((uint)uVar24 & ~(-1 << ((byte)uVar13 & 0x1f)));
  while( true ) {
    bVar4 = *(byte *)((long)pPVar11 + uVar23 * 4 + 1);
    uVar24 = uVar24 >> (bVar4 & 0x3f);
    bVar5 = (byte)pPVar11[uVar23 * 2];
    uVar6 = pPVar11[uVar23 * 2 + 1];
    uVar15 = uVar15 - bVar4;
    if (bVar5 == 0) break;
    if ((bVar5 & 0x10) != 0) {
      uVar30 = (uint)uVar6;
      uVar17 = bVar5 & 0xf;
      if ((bVar5 & 0xf) != 0) {
        if (uVar15 < uVar17) {
          pbVar1 = pBVar20 + 1;
          pBVar20 = pBVar20 + 1;
          uVar24 = uVar24 + ((ulong)*pbVar1 << ((byte)uVar15 & 0x3f));
          uVar15 = uVar15 + 8;
        }
        uVar30 = (uint)uVar6 + (~(-1 << (sbyte)uVar17) & (uint)uVar24);
        uVar24 = uVar24 >> (sbyte)uVar17;
        uVar15 = uVar15 - uVar17;
      }
      if (uVar15 < 0xf) {
        pbVar1 = pBVar20 + 1;
        pbVar2 = pBVar20 + 2;
        pBVar20 = pBVar20 + 2;
        uVar24 = ((ulong)*pbVar2 << ((byte)uVar15 + 8 & 0x3f)) +
                 ((ulong)*pbVar1 << ((byte)uVar15 & 0x3f)) + uVar24;
        uVar15 = uVar15 | 0x10;
      }
      uVar23 = (ulong)((uint)uVar24 & ~(-1 << ((byte)uVar14 & 0x1f)));
      bVar5 = (byte)pPVar12[uVar23 * 2];
      bVar4 = *(byte *)((long)pPVar12 + uVar23 * 4 + 1);
      PVar27 = pPVar12[uVar23 * 2 + 1];
      uVar24 = uVar24 >> (bVar4 & 0x3f);
      uVar15 = uVar15 - bVar4;
      goto LAB_00146513;
    }
    if ((bVar5 & 0x40) != 0) {
      uVar18 = 0xb;
      if ((bVar5 & 0x20) != 0) goto LAB_001467e9;
      pcVar16 = "invalid literal/length code";
      goto LAB_001467e0;
    }
    uVar23 = (ulong)(~(-1 << (bVar5 & 0x1f)) & (uint)uVar24) + (ulong)uVar6;
  }
  pBVar26[1] = (Bytef)uVar6;
  pBVar26 = pBVar26 + 1;
  goto LAB_0014679a;
LAB_00146513:
  if ((bVar5 & 0x10) != 0) goto LAB_00146551;
  if ((bVar5 & 0x40) != 0) {
    pcVar16 = "invalid distance code";
    goto LAB_001467e0;
  }
  lVar25 = (ulong)(~(-1 << (bVar5 & 0x1f)) & (uint)uVar24) + (ulong)PVar27;
  bVar4 = *(byte *)((long)pPVar12 + lVar25 * 4 + 1);
  uVar24 = uVar24 >> (bVar4 & 0x3f);
  bVar5 = (byte)pPVar12[lVar25 * 2];
  PVar27 = pPVar12[lVar25 * 2 + 1];
  uVar15 = uVar15 - bVar4;
  goto LAB_00146513;
LAB_00146551:
  uVar17 = bVar5 & 0xf;
  if (uVar15 < uVar17) {
    uVar24 = ((ulong)pBVar20[1] << ((byte)uVar15 & 0x3f)) + uVar24;
    uVar22 = uVar15 + 8;
    if (uVar22 < uVar17) {
      pbVar1 = pBVar20 + 2;
      pBVar20 = pBVar20 + 2;
      uVar24 = uVar24 + ((ulong)*pbVar1 << ((byte)uVar22 & 0x3f));
      uVar15 = uVar15 + 0x10;
    }
    else {
      pBVar20 = pBVar20 + 1;
      uVar15 = uVar22;
    }
  }
  uVar22 = (~(-1 << (sbyte)uVar17) & (uint)uVar24) + (uint)PVar27;
  uVar24 = uVar24 >> (sbyte)uVar17;
  uVar15 = uVar15 - uVar17;
  uVar17 = (int)pBVar26 - local_40;
  uVar28 = uVar22 - uVar17;
  if (uVar22 < uVar17 || uVar28 == 0) {
    uVar23 = (ulong)uVar22;
    lVar25 = 0;
    uVar17 = uVar30;
    do {
      lVar19 = lVar25;
      pBVar26[lVar19 + 1] = pBVar26[lVar19 + (1 - uVar23)];
      pBVar26[lVar19 + 2] = pBVar26[lVar19 + (2 - uVar23)];
      pBVar26[lVar19 + 3] = pBVar26[lVar19 + (3 - uVar23)];
      uVar17 = uVar17 - 3;
      lVar25 = lVar19 + 3;
    } while (2 < uVar17);
    if ((uint)lVar25 == uVar30) {
      pBVar26 = pBVar26 + lVar25;
    }
    else {
      pBVar26[lVar19 + 4] = pBVar26[-uVar23 + 1 + lVar25];
      if ((uint)lVar25 - uVar30 == -2) {
        pBVar3 = pBVar26 + -uVar23 + 2 + lVar25;
        pBVar26 = pBVar26 + lVar19 + 5;
        *pBVar26 = *pBVar3;
      }
      else {
        pBVar26 = pBVar26 + lVar19 + 4;
      }
    }
    goto LAB_0014679a;
  }
  if (uVar8 < uVar28) {
    pcVar16 = "invalid distance too far back";
LAB_001467e0:
    strm->msg = pcVar16;
    uVar18 = 0x1b;
LAB_001467e9:
    *(undefined4 *)&piVar10->strm = uVar18;
LAB_001467ec:
    lVar21 = (long)pBVar20 - (ulong)(uVar15 >> 3);
    strm->next_in = (Bytef *)(lVar21 + 1);
    strm->next_out = pBVar26 + 1;
    strm->avail_in = ((int)pBVar29 - (int)lVar21) + 5;
    uVar24 = (ulong)((uint)uVar24 & ~(-1 << (sbyte)(uVar15 & 7)));
    strm->avail_out = ((int)pBVar31 - (int)pBVar26) + 0x101;
    piVar10->w_bits = (int)uVar24;
    piVar10->w_mask = (int)(uVar24 >> 0x20);
    *(uint *)&piVar10->window = uVar15 & 7;
    return;
  }
  if (uVar9 == 0) {
    uVar23 = (ulong)(iVar7 - uVar28);
    uVar17 = uVar30 - uVar28;
    if (uVar30 < uVar28 || uVar17 == 0) goto LAB_00146727;
    lVar25 = 0;
    do {
      pBVar26[1] = *(Bytef *)(uVar23 + lVar21 + lVar25);
      pBVar26 = pBVar26 + 1;
      lVar25 = lVar25 + 1;
    } while (uVar28 != (uint)lVar25);
LAB_0014671a:
    lVar25 = (long)pBVar26 - (ulong)uVar22;
  }
  else {
    if (uVar9 < uVar28) {
      uVar23 = (ulong)((uVar9 + iVar7) - uVar28);
      uVar28 = uVar28 - uVar9;
      uVar17 = uVar30 - uVar28;
      if (uVar28 <= uVar30 && uVar17 != 0) {
        lVar25 = 0;
        do {
          pBVar26[lVar25 + 1] = *(Bytef *)(uVar23 + lVar21 + lVar25);
          lVar25 = lVar25 + 1;
        } while (uVar28 != (uint)lVar25);
        pBVar26 = pBVar26 + lVar25;
        lVar25 = lVar21 + -1;
        if (uVar9 < uVar17) {
          lVar25 = 0;
          do {
            pBVar26[1] = *(Bytef *)(lVar21 + lVar25);
            pBVar26 = pBVar26 + 1;
            lVar25 = lVar25 + 1;
          } while (uVar9 != (uint)lVar25);
          uVar17 = uVar17 - uVar9;
          goto LAB_0014671a;
        }
        goto joined_r0x00146730;
      }
    }
    else {
      uVar23 = (ulong)(uVar9 - uVar28);
      uVar17 = uVar30 - uVar28;
      if (uVar28 <= uVar30 && uVar17 != 0) {
        lVar25 = 0;
        do {
          pBVar26[1] = *(Bytef *)(uVar23 + lVar21 + lVar25);
          pBVar26 = pBVar26 + 1;
          lVar25 = lVar25 + 1;
        } while (uVar28 != (uint)lVar25);
        goto LAB_0014671a;
      }
    }
LAB_00146727:
    lVar25 = uVar23 + lVar21 + -1;
    uVar17 = uVar30;
  }
joined_r0x00146730:
  for (; 2 < uVar17; uVar17 = uVar17 - 3) {
    pBVar26[1] = *(Bytef *)(lVar25 + 1);
    pBVar26[2] = *(Bytef *)(lVar25 + 2);
    pBVar26[3] = *(Bytef *)(lVar25 + 3);
    pBVar26 = pBVar26 + 3;
    lVar25 = lVar25 + 3;
  }
  if (uVar17 != 0) {
    pBVar26[1] = *(Bytef *)(lVar25 + 1);
    if (uVar17 == 2) {
      pBVar26[2] = *(Bytef *)(lVar25 + 2);
      pBVar26 = pBVar26 + 2;
    }
    else {
      pBVar26 = pBVar26 + 1;
    }
  }
LAB_0014679a:
  if ((pBVar29 <= pBVar20) || (pBVar31 <= pBVar26)) goto LAB_001467ec;
  goto LAB_0014640f;
}

Assistant:

void inflate_fast(strm, start)
z_streamp strm;
unsigned start;         /* inflate()'s starting value for strm->avail_out */
{
    struct inflate_state FAR *state;
    unsigned char FAR *in;      /* local strm->next_in */
    unsigned char FAR *last;    /* while in < last, enough input available */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned write;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code this;                  /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in - OFF;
    last = in + (strm->avail_in - 5);
    out = strm->next_out - OFF;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    write = state->write;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
        }
        this = lcode[hold & lmask];
      dolen:
        op = (unsigned)(this.bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(this.op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, this.val >= 0x20 && this.val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", this.val));
            PUP(out) = (unsigned char)(this.val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(this.val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
            }
            this = dcode[hold & dmask];
          dodist:
            op = (unsigned)(this.bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(this.op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(this.val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(PUP(in)) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        strm->msg = (char *)"invalid distance too far back";
                        state->mode = BAD;
                        break;
                    }
                    from = window - OFF;
                    if (write == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (write < op) {      /* wrap around window */
                        from += wsize + write - op;
                        op -= write;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = window - OFF;
                            if (write < len) {  /* some from start of window */
                                op = write;
                                len -= op;
                                do {
                                    PUP(out) = PUP(from);
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += write - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    }
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                this = dcode[this.val + (hold & ((1U << op) - 1))];
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            this = lcode[this.val + (hold & ((1U << op) - 1))];
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in + OFF;
    strm->next_out = out + OFF;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}